

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O3

optional<unsigned_long> __thiscall
cappuccino::utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_find
          (utlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,time_point now,peek peek)

{
  long lVar1;
  size_t element_idx;
  _Storage<unsigned_long,_true> _Var2;
  _Storage<unsigned_long,_true> extraout_RAX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  uint unaff_EBX;
  __off64_t *in_R8;
  size_t in_R9;
  optional<unsigned_long> oVar4;
  
  _Var2 = (_Storage<unsigned_long,_true>)
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x50),key);
  if ((__node_type *)_Var2._M_value != (__node_type *)0x0) {
    element_idx = *(size_t *)(_Var2._M_value + 0x10);
    if ((long)now.__d.__r < *(long *)(*(long *)(this + 0x38) + element_idx * 0x28)) {
      lVar1 = *(long *)(this + 0x38) + element_idx * 0x28;
      uVar3 = extraout_RDX;
      if (peek == no) {
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x88),
                   (int)*(undefined8 *)(this + 0x88),(__off64_t *)(this + 0x88),
                   (int)*(undefined8 *)(lVar1 + 0x10),in_R8,in_R9,unaff_EBX);
        uVar3 = extraout_RDX_00;
      }
      _Var2 = (_Storage<unsigned_long,_true>)
              ((_Storage<unsigned_long,_true> *)(lVar1 + 0x20))->_M_value;
      uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
      goto LAB_001311fb;
    }
    do_erase(this,element_idx);
    _Var2 = extraout_RAX;
  }
  uVar3 = 0;
LAB_001311fb:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

auto do_find(const key_type& key, std::chrono::steady_clock::time_point now, peek peek) -> std::optional<value_type>
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            size_t   element_idx = keyed_position->second;
            element& e           = m_elements[element_idx];

            // Has the element TTL'ed?
            if (now < e.m_expire_time)
            {
                // Do not update items access if peeking.
                if (peek == peek::no)
                {
                    do_access(e);
                }
                return {e.m_value};
            }
            else
            {
                do_erase(element_idx);
            }
        }

        return {};
    }